

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_style_push_font(nk_context *ctx,nk_user_font *font)

{
  int iVar1;
  long lVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3995,"int nk_style_push_font(struct nk_context *, const struct nk_user_font *)"
                 );
  }
  iVar1 = (ctx->stacks).fonts.head;
  lVar2 = (long)iVar1;
  if (lVar2 < 8) {
    (ctx->stacks).fonts.head = iVar1 + 1;
    (ctx->stacks).fonts.elements[lVar2].address = &(ctx->style).font;
    (ctx->stacks).fonts.elements[lVar2].old_value = (ctx->style).font;
    (ctx->style).font = font;
    return 1;
  }
  __assert_fail("font_stack->head < (int)(sizeof(font_stack->elements)/sizeof(font_stack->elements)[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x3999,"int nk_style_push_font(struct nk_context *, const struct nk_user_font *)");
}

Assistant:

NK_API int
nk_style_push_font(struct nk_context *ctx, const struct nk_user_font *font)
{
    struct nk_config_stack_user_font *font_stack;
    struct nk_config_stack_user_font_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    font_stack = &ctx->stacks.fonts;
    NK_ASSERT(font_stack->head < (int)NK_LEN(font_stack->elements));
    if (font_stack->head >= (int)NK_LEN(font_stack->elements))
        return 0;

    element = &font_stack->elements[font_stack->head++];
    element->address = &ctx->style.font;
    element->old_value = ctx->style.font;
    ctx->style.font = font;
    return 1;
}